

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

IVideoDriver * irr::video::createNullDriver(IFileSystem *io,dimension2d<unsigned_int> *screenSize)

{
  CNullDriver *this;
  long *plVar1;
  int iVar2;
  bool bVar3;
  
  this = (CNullDriver *)operator_new(0x4a8);
  CNullDriver::CNullDriver(this,io,screenSize);
  iVar2 = 5;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    plVar1 = (long *)operator_new(0x20);
    plVar1[2] = 0;
    plVar1[3] = 0;
    *(undefined4 *)(plVar1 + 3) = 1;
    *plVar1 = (long)&PTR_OnSetMaterial_00280a58;
    plVar1[1] = (long)&PTR__IMaterialRenderer_00280ab0;
    (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x4d])(this,plVar1,0);
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
  }
  return &this->super_IVideoDriver;
}

Assistant:

IVideoDriver *createNullDriver(io::IFileSystem *io, const core::dimension2d<u32> &screenSize)
{
	CNullDriver *nullDriver = new CNullDriver(io, screenSize);

	// create empty material renderers
	for (u32 i = 0; sBuiltInMaterialTypeNames[i]; ++i) {
		IMaterialRenderer *imr = new IMaterialRenderer();
		nullDriver->addMaterialRenderer(imr);
		imr->drop();
	}

	return nullDriver;
}